

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,string *linkLibraries,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *tgt,bool relink,bool forResponseFile,bool useWatcomQuote)

{
  cmOutputConverter *pcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  int iVar5;
  char *pcVar6;
  cmComputeLinkInformation *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  ItemVector *pIVar9;
  size_t sVar10;
  string *psVar11;
  undefined7 in_register_00000089;
  pointer pbVar12;
  pointer pIVar13;
  string standardLibsVar;
  string linkLanguage;
  string linkLibs;
  string linkFlagsVar;
  string libPathTerminator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runtimeDirs;
  string fwSearchFlagVar;
  string libPathFlag;
  string config;
  ostringstream fout;
  string local_318;
  cmLocalGenerator *local_2f8;
  cmComputeLinkInformation *local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  OutputFormat local_2c4;
  long *local_2c0 [2];
  long local_2b0 [2];
  string local_2a0;
  undefined4 local_27c;
  string local_278;
  string local_258;
  undefined1 local_238 [40];
  string local_210;
  string *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  local_27c = (undefined4)CONCAT71(in_register_00000089,relink);
  local_2c4 = RESPONSE;
  if (!forResponseFile) {
    local_2c4 = useWatcomQuote | SHELL;
  }
  local_1f0 = linkLibraries;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar2 = this->Makefile;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2f8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"CMAKE_BUILD_TYPE","");
  pcVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_2a0);
  std::__cxx11::string::string((string *)&local_1c8,pcVar6,(allocator *)local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                             local_2a0.field_2._M_local_buf[0]) + 1);
  }
  pcVar7 = cmTarget::GetLinkInformation(tgt->Target,&local_1c8);
  if (pcVar7 != (cmComputeLinkInformation *)0x0) {
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    local_2a0._M_string_length = 0;
    local_2a0.field_2._M_local_buf[0] = '\0';
    local_2c0[0] = local_2b0;
    pcVar3 = (pcVar7->LinkLanguage)._M_dataplus._M_p;
    local_2f0 = pcVar7;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c0,pcVar3,pcVar3 + (pcVar7->LinkLanguage)._M_string_length);
    pcVar2 = local_2f8->Makefile;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,"CMAKE_LIBRARY_PATH_FLAG","");
    pcVar6 = cmMakefile::GetRequiredDefinition(pcVar2,&local_258);
    std::__cxx11::string::string((string *)&local_1e8,pcVar6,(allocator *)&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = local_2f8->Makefile;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"CMAKE_LIBRARY_PATH_TERMINATOR","");
    pcVar6 = cmMakefile::GetSafeDefinition(pcVar2,&local_278);
    std::__cxx11::string::string((string *)&local_258,pcVar6,(allocator *)&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"CMAKE_SHARED_LIBRARY_LINK_","");
    std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_2c0[0]);
    std::__cxx11::string::append((char *)&local_278);
    iVar5 = cmGeneratorTarget::GetType(tgt);
    if (iVar5 == 0) {
      pcVar6 = cmMakefile::GetSafeDefinition(local_2f8->Makefile,&local_278);
      sVar4 = local_2a0._M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&local_2a0,0,(char *)sVar4,(ulong)pcVar6);
      std::__cxx11::string::append((char *)&local_2a0);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_2c0[0]);
    std::__cxx11::string::append((char *)&local_210);
    pcVar6 = cmMakefile::GetDefinition(local_2f8->Makefile,&local_210);
    if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
      pvVar8 = cmComputeLinkInformation::GetFrameworkPaths_abi_cxx11_(local_2f0);
      pbVar12 = (pvVar8->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pbVar12 !=
          (pvVar8->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar1 = &local_2f8->super_cmOutputConverter;
        do {
          std::__cxx11::string::append((char *)frameworkPath);
          cmOutputConverter::Convert(&local_318,pcVar1,pbVar12,NONE,local_2c4);
          std::__cxx11::string::_M_append((char *)frameworkPath,(ulong)local_318._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,
                            CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                     local_318.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::string::append((char *)frameworkPath);
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 !=
                 (pvVar8->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    pvVar8 = cmComputeLinkInformation::GetDirectories_abi_cxx11_(local_2f0);
    pbVar12 = (pvVar8->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar12 !=
        (pvVar8->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar1 = &local_2f8->super_cmOutputConverter;
      do {
        cmOutputConverter::ConvertToOutputForExisting
                  (&local_318,pcVar1,pbVar12,START_OUTPUT,local_2c4);
        std::operator+(&local_2e8," ",&local_1e8);
        std::__cxx11::string::_M_append((char *)linkPath,(ulong)local_2e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append((char *)linkPath,(ulong)local_318._M_dataplus._M_p);
        std::__cxx11::string::_M_append((char *)linkPath,(ulong)local_258._M_dataplus._M_p);
        std::__cxx11::string::append((char *)linkPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,
                          CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                   local_318.field_2._M_local_buf[0]) + 1);
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 !=
               (pvVar8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    pIVar9 = cmComputeLinkInformation::GetItems(local_2f0);
    pIVar13 = (pIVar9->
              super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pIVar13 !=
        (pIVar9->
        super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if ((pIVar13->Target == (cmTarget *)0x0) ||
           (pIVar13->Target->TargetTypeValue != INTERFACE_LIBRARY)) {
          if (pIVar13->IsPath == true) {
            (*local_2f8->_vptr_cmLocalGenerator[0xe])(&local_318,local_2f8,pIVar13);
            std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_318._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p,
                              CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                       local_318.field_2._M_local_buf[0]) + 1);
            }
          }
          else {
            std::__cxx11::string::_M_append
                      ((char *)&local_2a0,(ulong)(pIVar13->Value)._M_dataplus._M_p);
          }
          std::__cxx11::string::append((char *)&local_2a0);
        }
        pIVar13 = pIVar13 + 1;
      } while (pIVar13 !=
               (pIVar9->
               super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    if ((local_2f0->RuntimeSep)._M_string_length == 0) {
      local_238._0_8_ = (string *)0x0;
      local_238._8_8_ = (string *)0x0;
      local_238._16_8_ = (pointer)0x0;
      cmComputeLinkInformation::GetRPath
                (local_2f0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_238,local_27c._0_1_);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      local_318._M_string_length = 0;
      local_318.field_2._M_local_buf[0] = '\0';
      if (local_238._0_8_ != local_238._8_8_) {
        pcVar1 = &local_2f8->super_cmOutputConverter;
        psVar11 = (string *)local_238._0_8_;
        do {
          std::__cxx11::string::_M_append
                    ((char *)&local_318,(ulong)(local_2f0->RuntimeFlag)._M_dataplus._M_p);
          cmOutputConverter::Convert(&local_2e8,pcVar1,psVar11,NONE,local_2c4);
          std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_2e8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_318);
          psVar11 = psVar11 + 1;
        } while (psVar11 != (string *)local_238._8_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_318._M_dataplus._M_p,local_318._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,
                        CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                 local_318.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_238);
    }
    else {
      cmComputeLinkInformation::GetRPathString_abi_cxx11_(&local_318,local_2f0,local_27c._0_1_);
      if (local_318._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(local_2f0->RuntimeFlag)._M_dataplus._M_p,
                   (local_2f0->RuntimeFlag)._M_string_length);
        cmOutputConverter::EscapeForShell
                  (&local_2e8,&local_2f8->super_cmOutputConverter,&local_318,!forResponseFile,false,
                   false);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,
                        CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                 local_318.field_2._M_local_buf[0]) + 1);
      }
    }
    pcVar7 = local_2f0;
    cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_(&local_318,local_2f0);
    sVar4 = (pcVar7->RPathLinkFlag)._M_string_length;
    if ((sVar4 != 0) && (local_318._M_string_length != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(local_2f0->RPathLinkFlag)._M_dataplus._M_p,sVar4);
      cmOutputConverter::EscapeForShell
                (&local_2e8,&local_2f8->super_cmOutputConverter,&local_318,!forResponseFile,false,
                 false);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    }
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"CMAKE_","");
    psVar11 = (string *)(local_238 + 0x10);
    pcVar3 = (local_2f0->LinkLanguage)._M_dataplus._M_p;
    local_238._0_8_ = psVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,pcVar3,pcVar3 + (local_2f0->LinkLanguage)._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_2e8,local_238._0_8_);
    if ((string *)local_238._0_8_ != psVar11) {
      operator_delete((void *)local_238._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_238._16_8_)->_M_p + 1));
    }
    std::__cxx11::string::append((char *)&local_2e8);
    pcVar6 = cmMakefile::GetDefinition(local_2f8->Makefile,&local_2e8);
    if (pcVar6 != (char *)0x0) {
      sVar10 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_1f0,(string *)local_238);
    if ((string *)local_238._0_8_ != psVar11) {
      operator_delete((void *)local_238._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_238._16_8_)->_M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,
                      CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                               local_318.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_2c0[0] != local_2b0) {
      operator_delete(local_2c0[0],local_2b0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,
                      CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                               local_2a0.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(std::string& linkLibraries,
                                           std::string& frameworkPath,
                                           std::string& linkPath,
                                           cmGeneratorTarget &tgt,
                                           bool relink,
                                           bool forResponseFile,
                                           bool useWatcomQuote)
{
  OutputFormat shellFormat = (forResponseFile) ? RESPONSE :
                             ((useWatcomQuote) ? WATCOMQUOTE : SHELL);
  bool escapeAllowMakeVars = !forResponseFile;
  std::ostringstream fout;
  std::string config = this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmComputeLinkInformation* pcli = tgt.Target->GetLinkInformation(config);
  if(!pcli)
    {
    return;
    }
  cmComputeLinkInformation& cli = *pcli;

  // Collect library linking flags command line options.
  std::string linkLibs;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  std::string libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Flags to link an executable to shared libraries.
  std::string linkFlagsVar = "CMAKE_SHARED_LIBRARY_LINK_";
  linkFlagsVar += linkLanguage;
  linkFlagsVar += "_FLAGS";
  if( tgt.GetType() == cmTarget::EXECUTABLE )
    {
    linkLibs = this->Makefile->GetSafeDefinition(linkFlagsVar);
    linkLibs += " ";
    }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag =
    this->Makefile->GetDefinition(fwSearchFlagVar);
  if(fwSearchFlag && *fwSearchFlag)
    {
    std::vector<std::string> const& fwDirs = cli.GetFrameworkPaths();
    for(std::vector<std::string>::const_iterator fdi = fwDirs.begin();
        fdi != fwDirs.end(); ++fdi)
      {
      frameworkPath += fwSearchFlag;
      frameworkPath += this->Convert(*fdi, NONE, shellFormat);
      frameworkPath += " ";
      }
    }

  // Append the library search path flags.
  std::vector<std::string> const& libDirs = cli.GetDirectories();
  for(std::vector<std::string>::const_iterator libDir = libDirs.begin();
      libDir != libDirs.end(); ++libDir)
    {
    std::string libpath = this->ConvertToOutputForExisting(*libDir,
                                                           START_OUTPUT,
                                                           shellFormat);
    linkPath += " " + libPathFlag;
    linkPath += libpath;
    linkPath += libPathTerminator;
    linkPath += " ";
    }

  // Append the link items.
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for(ItemVector::const_iterator li = items.begin(); li != items.end(); ++li)
    {
    if(li->Target && li->Target->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    if(li->IsPath)
      {
      linkLibs += this->ConvertToLinkReference(li->Value, shellFormat);
      }
    else
      {
      linkLibs += li->Value;
      }
    linkLibs += " ";
    }

  // Write the library flags to the build rule.
  fout << linkLibs;

  // Check what kind of rpath flags to use.
  if(cli.GetRuntimeSep().empty())
    {
    // Each rpath entry gets its own option ("-R a -R b -R c")
    std::vector<std::string> runtimeDirs;
    cli.GetRPath(runtimeDirs, relink);

    std::string rpath;
    for(std::vector<std::string>::iterator ri = runtimeDirs.begin();
        ri != runtimeDirs.end(); ++ri)
      {
      rpath += cli.GetRuntimeFlag();
      rpath += this->Convert(*ri, NONE, shellFormat);
      rpath += " ";
      }
    fout << rpath;
    }
  else
    {
    // All rpath entries are combined ("-Wl,-rpath,a:b:c").
    std::string rpath = cli.GetRPathString(relink);

    // Store the rpath option in the stream.
    if(!rpath.empty())
      {
      fout << cli.GetRuntimeFlag();
      fout << this->EscapeForShell(rpath, escapeAllowMakeVars);
      fout << " ";
      }
    }

  // Add the linker runtime search path if any.
  std::string rpath_link = cli.GetRPathLinkString();
  if(!cli.GetRPathLinkFlag().empty() && !rpath_link.empty())
    {
    fout << cli.GetRPathLinkFlag();
    fout << this->EscapeForShell(rpath_link, escapeAllowMakeVars);
    fout << " ";
    }

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  if(const char* stdLibs =
     this->Makefile->GetDefinition(standardLibsVar))
    {
    fout << stdLibs << " ";
    }

  linkLibraries = fout.str();
}